

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cc
# Opt level: O0

int main(int argc,char **argv)

{
  initializer_list<std::basic_ostream<char,_std::char_traits<char>_>_*> __l;
  bool bVar1;
  Option *pOVar2;
  vector<uttamarin::LemmaJob,_std::allocator<uttamarin::LemmaJob>_> local_928;
  shared_ptr<uttamarin::UtTamarinConfig> local_910;
  undefined1 local_900 [8];
  unique_ptr<uttamarin::LemmaJobGenerator,_std::default_delete<uttamarin::LemmaJobGenerator>_>
  lemma_job_generator;
  shared_ptr<uttamarin::UtTamarinConfig> local_8e8;
  unique_ptr<uttamarin::TheoryPreprocessor,_std::default_delete<uttamarin::TheoryPreprocessor>_>
  local_8d8;
  unique_ptr<uttamarin::LemmaProcessor,_std::default_delete<uttamarin::LemmaProcessor>_> local_8d0;
  undefined1 local_8c8 [8];
  App app;
  shared_ptr<uttamarin::OutputWriter> output_writer;
  undefined1 local_880 [8];
  ofstream output_file_stream;
  allocator<std::basic_ostream<char,_std::char_traits<char>_>_*> local_679;
  basic_ostream<char,_std::char_traits<char>_> *local_678;
  iterator local_670;
  size_type local_668;
  undefined1 local_660 [8];
  vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
  output_streams;
  __single_object theory_preprocessor;
  undefined1 local_638 [8];
  unique_ptr<uttamarin::LemmaProcessor,_std::default_delete<uttamarin::LemmaProcessor>_> local_630;
  unique_ptr<uttamarin::LemmaProcessor,_std::default_delete<uttamarin::LemmaProcessor>_>
  lemma_processor;
  shared_ptr<uttamarin::UtTamarinConfig> config;
  ParseError *e;
  string local_600;
  allocator<char> local_5d9;
  string local_5d8;
  allocator<char> local_5b1;
  string local_5b0;
  allocator<char> local_589;
  string local_588;
  allocator<char> local_561;
  string local_560;
  allocator<char> local_539;
  string local_538;
  allocator<char> local_511;
  string local_510;
  allocator<char> local_4e9;
  string local_4e8;
  allocator<char> local_4c1;
  string local_4c0;
  allocator<char> local_499;
  string local_498;
  allocator<char> local_471;
  string local_470;
  allocator<char> local_449;
  string local_448;
  allocator<char> local_421;
  string local_420;
  allocator<char> local_3f9;
  string local_3f8;
  allocator<char> local_3d1;
  string local_3d0;
  allocator<char> local_3a9;
  string local_3a8;
  allocator<char> local_381;
  string local_380;
  allocator<char> local_359;
  string local_358;
  allocator<char> local_331;
  string local_330;
  allocator<char> local_2f9;
  string local_2f8;
  undefined1 local_2d8 [8];
  App cli;
  CmdParameters parameters;
  char **argv_local;
  int argc_local;
  
  parameters._192_8_ = argv;
  uttamarin::termination::registerSIGINTHandler();
  uttamarin::CmdParameters::CmdParameters
            ((CmdParameters *)
             &cli.config_formatter_.super___shared_ptr<CLI::Config,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2f8,
             "UT Tamarin is a small tool that runs the Tamarin prover on selected\nlemmas and outputs statistics."
             ,&local_2f9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_330,"",&local_331);
  CLI::App::App((App *)local_2d8,&local_2f8,&local_330);
  std::__cxx11::string::~string((string *)&local_330);
  std::allocator<char>::~allocator((allocator<char> *)&local_331);
  std::__cxx11::string::~string((string *)&local_2f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_2f9);
  std::__cxx11::string::operator=
            ((string *)
             &cli.config_formatter_.super___shared_ptr<CLI::Config,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,"");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_358,"spthy_file",&local_359);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_380,"Path to a .spthy file containing a Tamarin theory.",&local_381);
  pOVar2 = CLI::App::
           add_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(CLI::detail::enabler)0>
                     ((App *)local_2d8,&local_358,
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      &cli.config_formatter_.
                       super___shared_ptr<CLI::Config,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                      &local_380);
  pOVar2 = CLI::OptionBase<CLI::Option>::required(&pOVar2->super_OptionBase<CLI::Option>,true);
  CLI::Option::check(pOVar2,(Validator *)CLI::ExistingFile);
  std::__cxx11::string::~string((string *)&local_380);
  std::allocator<char>::~allocator((allocator<char> *)&local_381);
  std::__cxx11::string::~string((string *)&local_358);
  std::allocator<char>::~allocator((allocator<char> *)&local_359);
  parameters.proof_directory.field_2._M_local_buf[0xc] = '\x01';
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_3a8,"-a,--abort_after_failure",&local_3a9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_3d0,"Tells the tool to abort if Tamarin fails to prove a lemma.",
             &local_3d1);
  CLI::App::add_flag<bool,_(CLI::detail::enabler)0>
            ((App *)local_2d8,&local_3a8,
             (bool *)(parameters.proof_directory.field_2._M_local_buf + 0xc),&local_3d0);
  std::__cxx11::string::~string((string *)&local_3d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_3d1);
  std::__cxx11::string::~string((string *)&local_3a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_3a9);
  parameters.proof_directory.field_2._M_local_buf[0xd] = '\0';
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_3f8,"-q,--quiet",&local_3f9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_420,"Disables the timer on the command line.",&local_421);
  CLI::App::add_flag<bool,_(CLI::detail::enabler)0>
            ((App *)local_2d8,&local_3f8,
             (bool *)(parameters.proof_directory.field_2._M_local_buf + 0xd),&local_420);
  std::__cxx11::string::~string((string *)&local_420);
  std::allocator<char>::~allocator((allocator<char> *)&local_421);
  std::__cxx11::string::~string((string *)&local_3f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_3f9);
  std::__cxx11::string::operator=
            ((string *)(parameters.spthy_file_path.field_2._M_local_buf + 8),"");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_448,"-c,--config_file",&local_449);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_470,"Configuration file for UT Tamarin.",&local_471);
  pOVar2 = CLI::App::
           add_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(CLI::detail::enabler)0>
                     ((App *)local_2d8,&local_448,
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      ((long)&parameters.spthy_file_path.field_2 + 8),&local_470);
  CLI::Option::check(pOVar2,(Validator *)CLI::ExistingFile);
  std::__cxx11::string::~string((string *)&local_470);
  std::allocator<char>::~allocator((allocator<char> *)&local_471);
  std::__cxx11::string::~string((string *)&local_448);
  std::allocator<char>::~allocator((allocator<char> *)&local_449);
  std::__cxx11::string::operator=
            ((string *)(parameters.config_file_path.field_2._M_local_buf + 8),"");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_498,"-o,--output_file",&local_499);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_4c0,"File where UT Tamarin saves its output.",&local_4c1);
  CLI::App::
  add_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(CLI::detail::enabler)0>
            ((App *)local_2d8,&local_498,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((long)&parameters.config_file_path.field_2 + 8),&local_4c0);
  std::__cxx11::string::~string((string *)&local_4c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_4c1);
  std::__cxx11::string::~string((string *)&local_498);
  std::allocator<char>::~allocator((allocator<char> *)&local_499);
  std::__cxx11::string::operator=
            ((string *)(parameters.penetration_lemma.field_2._M_local_buf + 8),"");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_4e8,"-p, --proof_directory",&local_4e9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_510,"Directory where the proofs should be stored.",&local_511);
  CLI::App::
  add_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(CLI::detail::enabler)0>
            ((App *)local_2d8,&local_4e8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((long)&parameters.penetration_lemma.field_2 + 8),&local_510);
  std::__cxx11::string::~string((string *)&local_510);
  std::allocator<char>::~allocator((allocator<char> *)&local_511);
  std::__cxx11::string::~string((string *)&local_4e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_4e9);
  std::__cxx11::string::operator=((string *)(parameters.starting_lemma.field_2._M_local_buf + 8),"")
  ;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_538,"--penetration_lemma",&local_539);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_560,"Lemma to penetrate.",&local_561);
  CLI::App::
  add_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(CLI::detail::enabler)0>
            ((App *)local_2d8,&local_538,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((long)&parameters.starting_lemma.field_2 + 8),&local_560);
  std::__cxx11::string::~string((string *)&local_560);
  std::allocator<char>::~allocator((allocator<char> *)&local_561);
  std::__cxx11::string::~string((string *)&local_538);
  std::allocator<char>::~allocator((allocator<char> *)&local_539);
  std::__cxx11::string::operator=
            ((string *)(parameters.output_file_path.field_2._M_local_buf + 8),"");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_588,"-s,--start",&local_589);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_5b0,"Name of the first lemma that should be verified.",&local_5b1);
  CLI::App::
  add_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(CLI::detail::enabler)0>
            ((App *)local_2d8,&local_588,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((long)&parameters.output_file_path.field_2 + 8),&local_5b0);
  std::__cxx11::string::~string((string *)&local_5b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_5b1);
  std::__cxx11::string::~string((string *)&local_588);
  std::allocator<char>::~allocator((allocator<char> *)&local_589);
  parameters.proof_directory.field_2._8_4_ = 600;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_5d8,"-t,--timeout",&local_5d9)
  ;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_600,
             "Per-lemma timeout in seconds (0 means no timeout, default: 600 seconds).",
             (allocator<char> *)((long)&e + 7));
  CLI::App::add_option<int,_(CLI::detail::enabler)0>
            ((App *)local_2d8,&local_5d8,
             (int *)(parameters.proof_directory.field_2._M_local_buf + 8),&local_600);
  std::__cxx11::string::~string((string *)&local_600);
  std::allocator<char>::~allocator((allocator<char> *)((long)&e + 7));
  std::__cxx11::string::~string((string *)&local_5d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_5d9);
  CLI::App::parse((App *)local_2d8,argc,(char **)parameters._192_8_);
  std::make_shared<uttamarin::UtTamarinConfig,uttamarin::CmdParameters&>
            ((CmdParameters *)&lemma_processor);
  std::make_unique<uttamarin::BashLemmaProcessor,std::__cxx11::string&,int&>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_638,
             (int *)(parameters.penetration_lemma.field_2._M_local_buf + 8));
  std::unique_ptr<uttamarin::LemmaProcessor,std::default_delete<uttamarin::LemmaProcessor>>::
  unique_ptr<uttamarin::BashLemmaProcessor,std::default_delete<uttamarin::BashLemmaProcessor>,void>
            ((unique_ptr<uttamarin::LemmaProcessor,std::default_delete<uttamarin::LemmaProcessor>> *
             )&local_630,
             (unique_ptr<uttamarin::BashLemmaProcessor,_std::default_delete<uttamarin::BashLemmaProcessor>_>
              *)local_638);
  CLI::std::
  unique_ptr<uttamarin::BashLemmaProcessor,_std::default_delete<uttamarin::BashLemmaProcessor>_>::
  ~unique_ptr((unique_ptr<uttamarin::BashLemmaProcessor,_std::default_delete<uttamarin::BashLemmaProcessor>_>
               *)local_638);
  if ((parameters.proof_directory.field_2._M_local_buf[0xd] & 1U) == 0) {
    std::
    make_unique<uttamarin::VerboseLemmaProcessor,std::unique_ptr<uttamarin::LemmaProcessor,std::default_delete<uttamarin::LemmaProcessor>>>
              ((unique_ptr<uttamarin::LemmaProcessor,_std::default_delete<uttamarin::LemmaProcessor>_>
                *)&theory_preprocessor);
    std::unique_ptr<uttamarin::LemmaProcessor,std::default_delete<uttamarin::LemmaProcessor>>::
    operator=((unique_ptr<uttamarin::LemmaProcessor,std::default_delete<uttamarin::LemmaProcessor>>
               *)&local_630,
              (unique_ptr<uttamarin::VerboseLemmaProcessor,_std::default_delete<uttamarin::VerboseLemmaProcessor>_>
               *)&theory_preprocessor);
    CLI::std::
    unique_ptr<uttamarin::VerboseLemmaProcessor,_std::default_delete<uttamarin::VerboseLemmaProcessor>_>
    ::~unique_ptr((unique_ptr<uttamarin::VerboseLemmaProcessor,_std::default_delete<uttamarin::VerboseLemmaProcessor>_>
                   *)&theory_preprocessor);
  }
  std::make_unique<uttamarin::M4TheoryPreprocessor,std::shared_ptr<uttamarin::UtTamarinConfig>&>
            ((shared_ptr<uttamarin::UtTamarinConfig> *)
             &output_streams.
              super__Vector_base<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  local_678 = (basic_ostream<char,_std::char_traits<char>_> *)&std::cout;
  local_670 = &local_678;
  local_668 = 1;
  CLI::std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>::allocator(&local_679);
  __l._M_len = local_668;
  __l._M_array = local_670;
  CLI::std::
  vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
  ::vector((vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
            *)local_660,__l,&local_679);
  CLI::std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>::~allocator(&local_679);
  std::ofstream::ofstream(local_880);
  bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          ((long)&parameters.config_file_path.field_2 + 8),"");
  if (bVar1) {
    std::ofstream::open((string *)local_880,(int)&parameters + (_S_trunc|_S_out|_S_in));
    output_writer.super___shared_ptr<uttamarin::OutputWriter,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_880;
    std::vector<std::ostream*,std::allocator<std::ostream*>>::emplace_back<std::ofstream*>
              ((vector<std::ostream*,std::allocator<std::ostream*>> *)local_660,
               (basic_ofstream<char,_std::char_traits<char>_> **)
               &output_writer.
                super___shared_ptr<uttamarin::OutputWriter,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
    ;
  }
  std::
  make_shared<uttamarin::OutputWriter,std::vector<std::ostream*,std::allocator<std::ostream*>>&>
            ((vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
              *)&app.output_writer_.
                 super___shared_ptr<uttamarin::OutputWriter,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            );
  CLI::std::unique_ptr<uttamarin::LemmaProcessor,_std::default_delete<uttamarin::LemmaProcessor>_>::
  unique_ptr(&local_8d0,&local_630);
  std::unique_ptr<uttamarin::TheoryPreprocessor,std::default_delete<uttamarin::TheoryPreprocessor>>
  ::
  unique_ptr<uttamarin::M4TheoryPreprocessor,std::default_delete<uttamarin::M4TheoryPreprocessor>,void>
            ((unique_ptr<uttamarin::TheoryPreprocessor,std::default_delete<uttamarin::TheoryPreprocessor>>
              *)&local_8d8,
             (unique_ptr<uttamarin::M4TheoryPreprocessor,_std::default_delete<uttamarin::M4TheoryPreprocessor>_>
              *)&output_streams.
                 super__Vector_base<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
  CLI::std::shared_ptr<uttamarin::UtTamarinConfig>::shared_ptr
            (&local_8e8,(shared_ptr<uttamarin::UtTamarinConfig> *)&lemma_processor);
  CLI::std::shared_ptr<uttamarin::OutputWriter>::shared_ptr
            ((shared_ptr<uttamarin::OutputWriter> *)&lemma_job_generator,
             (shared_ptr<uttamarin::OutputWriter> *)
             &app.output_writer_.
              super___shared_ptr<uttamarin::OutputWriter,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  uttamarin::App::App((App *)local_8c8,
                      (unique_ptr<uttamarin::LemmaProcessor,_std::default_delete<uttamarin::LemmaProcessor>_>
                       *)&local_8d0,
                      (unique_ptr<uttamarin::TheoryPreprocessor,_std::default_delete<uttamarin::TheoryPreprocessor>_>
                       *)&local_8d8,(shared_ptr<uttamarin::UtTamarinConfig> *)&local_8e8,
                      (shared_ptr<uttamarin::OutputWriter> *)&lemma_job_generator);
  CLI::std::shared_ptr<uttamarin::OutputWriter>::~shared_ptr
            ((shared_ptr<uttamarin::OutputWriter> *)&lemma_job_generator);
  CLI::std::shared_ptr<uttamarin::UtTamarinConfig>::~shared_ptr(&local_8e8);
  CLI::std::
  unique_ptr<uttamarin::TheoryPreprocessor,_std::default_delete<uttamarin::TheoryPreprocessor>_>::
  ~unique_ptr(&local_8d8);
  CLI::std::unique_ptr<uttamarin::LemmaProcessor,_std::default_delete<uttamarin::LemmaProcessor>_>::
  ~unique_ptr(&local_8d0);
  CLI::std::shared_ptr<uttamarin::UtTamarinConfig>::shared_ptr
            (&local_910,(shared_ptr<uttamarin::UtTamarinConfig> *)&lemma_processor);
  CreateLemmaJobGenerator
            ((CmdParameters *)local_900,
             (shared_ptr<uttamarin::UtTamarinConfig> *)
             &cli.config_formatter_.super___shared_ptr<CLI::Config,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  CLI::std::shared_ptr<uttamarin::UtTamarinConfig>::~shared_ptr(&local_910);
  CLI::std::
  unique_ptr<uttamarin::LemmaJobGenerator,_std::default_delete<uttamarin::LemmaJobGenerator>_>::
  operator->((unique_ptr<uttamarin::LemmaJobGenerator,_std::default_delete<uttamarin::LemmaJobGenerator>_>
              *)local_900);
  uttamarin::LemmaJobGenerator::GenerateLemmaJobs((LemmaJobGenerator *)&local_928);
  uttamarin::App::RunOnLemmas((App *)local_8c8,&local_928);
  CLI::std::vector<uttamarin::LemmaJob,_std::allocator<uttamarin::LemmaJob>_>::~vector
            ((vector<uttamarin::LemmaJob,_std::allocator<uttamarin::LemmaJob>_> *)&local_928);
  CLI::std::
  unique_ptr<uttamarin::LemmaJobGenerator,_std::default_delete<uttamarin::LemmaJobGenerator>_>::
  ~unique_ptr((unique_ptr<uttamarin::LemmaJobGenerator,_std::default_delete<uttamarin::LemmaJobGenerator>_>
               *)local_900);
  uttamarin::App::~App((App *)local_8c8);
  CLI::std::shared_ptr<uttamarin::OutputWriter>::~shared_ptr
            ((shared_ptr<uttamarin::OutputWriter> *)
             &app.output_writer_.
              super___shared_ptr<uttamarin::OutputWriter,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::ofstream::~ofstream(local_880);
  CLI::std::
  vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
  ::~vector((vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
             *)local_660);
  CLI::std::
  unique_ptr<uttamarin::M4TheoryPreprocessor,_std::default_delete<uttamarin::M4TheoryPreprocessor>_>
  ::~unique_ptr((unique_ptr<uttamarin::M4TheoryPreprocessor,_std::default_delete<uttamarin::M4TheoryPreprocessor>_>
                 *)&output_streams.
                    super__Vector_base<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
  CLI::std::unique_ptr<uttamarin::LemmaProcessor,_std::default_delete<uttamarin::LemmaProcessor>_>::
  ~unique_ptr(&local_630);
  CLI::std::shared_ptr<uttamarin::UtTamarinConfig>::~shared_ptr
            ((shared_ptr<uttamarin::UtTamarinConfig> *)&lemma_processor);
  CLI::App::~App((App *)local_2d8);
  uttamarin::CmdParameters::~CmdParameters
            ((CmdParameters *)
             &cli.config_formatter_.super___shared_ptr<CLI::Config,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return 0;
}

Assistant:

int main (int argc, char *argv[])
{
  termination::registerSIGINTHandler();

  CmdParameters parameters;

  CLI::App cli{
    "UT Tamarin is a small tool that runs the Tamarin prover on selected\n"
    "lemmas and outputs statistics." 
  };

  parameters.spthy_file_path = "";
  cli.add_option("spthy_file", parameters.spthy_file_path,
                 "Path to a .spthy file containing a Tamarin theory."
  )->required()->check(CLI::ExistingFile);

  parameters.abort_after_failure = true;
  cli.add_flag("-a,--abort_after_failure",
               parameters.abort_after_failure,
               "Tells the tool to abort if Tamarin fails to prove a lemma.");

  parameters.is_quiet = false;
  cli.add_flag("-q,--quiet",
               parameters.is_quiet,
               "Disables the timer on the command line.");

  parameters.config_file_path = "";
  cli.add_option("-c,--config_file", parameters.config_file_path,
                 "Configuration file for UT Tamarin."
  )->check(CLI::ExistingFile);

  parameters.output_file_path = "";
  cli.add_option("-o,--output_file", parameters.output_file_path,
                 "File where UT Tamarin saves its output.");

  parameters.proof_directory = "";
  cli.add_option("-p, --proof_directory", parameters.proof_directory,
                 "Directory where the proofs should be stored.");

  parameters.penetration_lemma = "";
  cli.add_option("--penetration_lemma", parameters.penetration_lemma,
                 "Lemma to penetrate.");

  parameters.starting_lemma = "";
  cli.add_option("-s,--start", parameters.starting_lemma,
                 "Name of the first lemma that should be verified.");

  parameters.timeout = 600;
  cli.add_option("-t,--timeout", parameters.timeout,
                 "Per-lemma timeout in seconds "
                 "(0 means no timeout, default: 600 seconds).");

  CLI11_PARSE(cli, argc, argv);

  auto config = std::make_shared<UtTamarinConfig>(parameters);

  std::unique_ptr<LemmaProcessor> lemma_processor =
          std::make_unique<BashLemmaProcessor>(parameters.proof_directory,
                                               parameters.timeout);

  if(!parameters.is_quiet) {
    lemma_processor =
          std::make_unique<VerboseLemmaProcessor>(std::move(lemma_processor));
  }

  auto theory_preprocessor = std::make_unique<M4TheoryPreprocessor>(config);

  std::vector<std::ostream*> output_streams = std::vector{&std::cout};
  std::ofstream output_file_stream;
  if(parameters.output_file_path != "") {
    output_file_stream.open(parameters.output_file_path);
    output_streams.emplace_back(&output_file_stream);
  }
  auto output_writer = std::make_shared<OutputWriter>(output_streams);

  App app (std::move(lemma_processor),
           std::move(theory_preprocessor),
           config,
           output_writer);

  auto lemma_job_generator = CreateLemmaJobGenerator(parameters, config);

  app.RunOnLemmas(lemma_job_generator->GenerateLemmaJobs());

  return 0;
}